

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::internal::JsonUnitTestResultPrinter::EscapeJson
                   (string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  string *psVar2;
  stringstream *psVar3;
  uchar value;
  ulong uVar4;
  char *pcVar5;
  ostream *poVar6;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  string *local_68;
  ostream *local_60;
  string local_58;
  stringstream *local_38;
  
  local_68 = __return_storage_ptr__;
  Message::Message((Message *)&local_70);
  local_38 = local_70.ptr_;
  if (str->_M_string_length != 0) {
    poVar6 = (ostream *)(local_70.ptr_ + 0x10);
    uVar4 = 0;
    local_60 = poVar6;
    do {
      bVar1 = (str->_M_dataplus)._M_p[uVar4];
      pcVar5 = "\\t";
      switch(bVar1) {
      case 8:
        pcVar5 = "\\b";
        break;
      case 9:
        break;
      case 10:
        pcVar5 = "\\n";
        break;
      case 0xb:
switchD_0012213f_caseD_b:
        if ((char)bVar1 < ' ') {
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\\u00",4);
          poVar6 = local_60;
          String::FormatByte_abi_cxx11_(&local_58,(String *)(ulong)bVar1,value);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                             (byte)local_58._M_dataplus._M_p),
                     local_58._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_58._M_dataplus._M_p._1_7_,(byte)local_58._M_dataplus._M_p) !=
              &local_58.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_58._M_dataplus._M_p._1_7_,(byte)local_58._M_dataplus._M_p
                                    ),local_58.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_58._M_dataplus._M_p._0_1_ = bVar1;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_58,1);
        }
        goto LAB_0012221d;
      case 0xc:
        pcVar5 = "\\f";
        break;
      case 0xd:
        pcVar5 = "\\r";
        break;
      default:
        if ((0x3a < bVar1 - 0x22) ||
           ((0x400000000002001U >> ((ulong)(bVar1 - 0x22) & 0x3f) & 1) == 0))
        goto switchD_0012213f_caseD_b;
        local_58._M_dataplus._M_p._0_1_ = 0x5c;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_58,1);
        local_58._M_dataplus._M_p._0_1_ = bVar1;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_58,1);
        goto LAB_0012221d;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar5,2);
LAB_0012221d:
      uVar4 = uVar4 + 1;
    } while (uVar4 < str->_M_string_length);
  }
  psVar3 = local_38;
  psVar2 = local_68;
  StringStreamToString(local_68,local_38);
  if (psVar3 != (stringstream *)0x0) {
    (**(code **)(*(long *)psVar3 + 8))(psVar3);
  }
  return psVar2;
}

Assistant:

std::string JsonUnitTestResultPrinter::EscapeJson(const std::string& str) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '\\':
      case '"':
      case '/':
        m << '\\' << ch;
        break;
      case '\b':
        m << "\\b";
        break;
      case '\t':
        m << "\\t";
        break;
      case '\n':
        m << "\\n";
        break;
      case '\f':
        m << "\\f";
        break;
      case '\r':
        m << "\\r";
        break;
      default:
        if (ch < ' ') {
          m << "\\u00" << String::FormatByte(static_cast<unsigned char>(ch));
        } else {
          m << ch;
        }
        break;
    }
  }

  return m.GetString();
}